

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ted_algorithm_touzet.h
# Opt level: O3

double __thiscall
ted::
TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>::
ted(TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
    *this,TreeIndexTouzetBaseline *t1,TreeIndexTouzetBaseline *t2)

{
  int iVar1;
  _func_int **pp_Var2;
  uint uVar3;
  double extraout_XMM0_Qa;
  int iVar4;
  
  iVar1 = (t1->super_Constants).tree_size_ - (t2->super_Constants).tree_size_;
  iVar4 = -iVar1;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  uVar3 = iVar4 + 1;
  pp_Var2 = (this->
            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
            )._vptr_TEDAlgorithm;
  while( true ) {
    (*pp_Var2[1])(this,t1,t2,(ulong)uVar3);
    if (extraout_XMM0_Qa <= (double)(int)uVar3) break;
    uVar3 = uVar3 * 2;
    pp_Var2 = (this->
              super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
              )._vptr_TEDAlgorithm;
  }
  return extraout_XMM0_Qa;
}

Assistant:

double ted(const TreeIndex& t1, const TreeIndex& t2) {

    // `+1` due to possible 0 size difference - then increase by mutliplication
    // doesn't work.
    // NOTE: This `+1` influences BandMatrix width.
    int k = std::abs(t1.tree_size_ - t2.tree_size_) + 1;

    // TODO: When computing ted without k, the matrices are newly initialised.
    //       Maybe resizing would be more efficient - but it needs to be
    //       implemented.

    double distance = ted_k(t1, t2, k);
    while (k < distance) {
      k = k * 2;
      // std::cerr << k << std::endl;
      // td_ = BandMatrix<double>(t1.tree_size_, k);
      // td_.Matrix::fill_with(std::numeric_limits<double>::infinity());
      // fd_ = BandMatrix<double>(t1.tree_size_ + 1, k + 1);
      // fd_.Matrix::fill_with(std::numeric_limits<double>::infinity());
      distance = ted_k(t1, t2, k);
    }
    return distance;
  }